

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O0

void skiwi::anon_unknown_1::compile_primitives_library(void)

{
  stringstream ss;
  pair<unsigned_long_(*)(void_*,____),_unsigned_long> *f_1;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<unsigned_long_(*)(void_*,____),_unsigned_long>,_std::allocator<std::pair<unsigned_long_(*)(void_*,____),_unsigned_long>_>_>
  *__range3;
  logic_error e;
  _func_unsigned_long_void_ptr_varargs *local_d0;
  fptr f;
  uint64_t size;
  first_pass_data d;
  char *local_40;
  asmcode local_38 [8];
  asmcode code;
  
  assembler::asmcode::asmcode(local_38);
  local_40 = (char *)std::__cxx11::string::c_str();
  (anonymous_namespace)::log<char_const*,char_const(&)[33]>
            (&local_40,(char (*) [33])"compiling primitives library...\n");
  skiwi::compile_primitives_library
            ((primitive_map *)((anonymous_namespace)::cd + 0x248),
             (repl_data *)((anonymous_namespace)::cd + 0x188),
             (environment_map *)((anonymous_namespace)::cd + 0x220),
             (context *)((anonymous_namespace)::cd + 0x30),local_38,
             (compiler_options *)((anonymous_namespace)::cd + 4));
  assembler::first_pass_data::first_pass_data((first_pass_data *)&size);
  local_d0 = (_func_unsigned_long_void_ptr_varargs *)
             assembler::assemble((ulong *)&f,(first_pass_data *)&size,local_38);
  (*local_d0)((anonymous_namespace)::cd + 0x30);
  std::
  vector<std::pair<unsigned_long(*)(void*,...),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,...),unsigned_long>>>
  ::emplace_back<unsigned_long(*&)(void*,___),unsigned_long&>
            ((vector<std::pair<unsigned_long(*)(void*,___),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,___),unsigned_long>>>
              *)((anonymous_namespace)::cd + 0x230),&local_d0,(unsigned_long *)&f);
  assign_primitive_addresses
            ((primitive_map *)((anonymous_namespace)::cd + 0x248),(first_pass_data *)&size,
             (uint64_t)local_d0);
  assembler::first_pass_data::~first_pass_data((first_pass_data *)&size);
  assembler::asmcode::~asmcode(local_38);
  return;
}

Assistant:

void compile_primitives_library()
    {
    using namespace SKIWI;
    asmcode code;
    try
      {
      log(prompt.c_str(), "compiling primitives library...\n");
      compile_primitives_library(cd.pm, cd.rd, cd.env, cd.ctxt, code, cd.ops);
      first_pass_data d;
      uint64_t size;
#ifdef _SKIWI_FOR_ARM
      registers reg;
      uint8_t* f = (uint8_t*)vm_bytecode(size, d, code);
#ifdef _WIN32
      reg.rcx = (uint64_t)(&cd.ctxt);
#else
      reg.rdi = (uint64_t)(&cd.ctxt);
#endif
      run_bytecode(f, size, reg);
      cd.compiled_bytecode.emplace_back(f, size);
#else
      compiler_data::fptr f = (compiler_data::fptr)assemble(size, d, code);
      f(&cd.ctxt);
      cd.compiled_functions.emplace_back(f, size);
#endif
      assign_primitive_addresses(cd.pm, d, (uint64_t)f);
      }
    catch (std::logic_error e)
      {
#ifdef _SKIWI_FOR_ARM
      for (auto& f : cd.compiled_bytecode)
        free_bytecode((void*)f.first, f.second);
#else
      for (auto& f : cd.compiled_functions)
        free_assembled_function((void*)f.first, f.second);
#endif
      destroy_contexts(cd);
      std::stringstream ss;
      ss << e.what() << " while compiling primitives library";
      throw std::logic_error(ss.str().c_str());
      }
    }